

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O1

void rtcIntersect16(int *valid,RTCScene hscene,RTCRayHit16 *rayhit,RTCIntersectArguments *args)

{
  long lVar1;
  RayHit ray1;
  RayQueryContext context;
  RTCRayQueryContext defaultContext;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  RTCScene local_70;
  RTCRayQueryContext *local_68;
  RTCIntersectArguments *local_60;
  RTCRayQueryContext local_58;
  RTCIntersectArguments local_50;
  
  if (args == (RTCIntersectArguments *)0x0) {
    args = &local_50;
    local_50.flags = RTC_RAY_QUERY_FLAG_INCOHERENT;
    local_50.feature_mask = RTC_FEATURE_FLAG_ALL;
    local_50.context = (RTCRayQueryContext *)0x0;
    local_50.filter = (RTCFilterFunctionN)0x0;
    local_50.intersect = (RTCIntersectFunctionN)0x0;
  }
  local_68 = args->context;
  if (local_68 == (RTCRayQueryContext *)0x0) {
    local_68 = &local_58;
    local_58.instID[0] = 0xffffffff;
    local_58.instPrimID[0] = 0xffffffff;
  }
  local_70 = hscene;
  local_60 = args;
  if (*(long *)(hscene + 0x138) == 0) {
    lVar1 = -0x40;
    do {
      if (*(int *)((long)valid + lVar1 + 0x40) != 0) {
        local_d8 = *(undefined4 *)((long)(rayhit->ray).org_y + lVar1);
        local_d4 = *(undefined4 *)((long)(rayhit->ray).org_z + lVar1);
        local_d0 = *(undefined4 *)((long)(rayhit->ray).tnear + lVar1);
        local_cc = *(undefined4 *)((long)(rayhit->ray).dir_x + lVar1);
        local_c8 = *(undefined4 *)((long)(rayhit->ray).dir_y + lVar1);
        local_c4 = *(undefined4 *)((long)(rayhit->ray).dir_z + lVar1);
        local_c0 = *(undefined4 *)((long)(rayhit->ray).time + lVar1);
        local_b8 = *(undefined4 *)((long)(rayhit->ray).mask + lVar1);
        local_bc = *(undefined4 *)((long)(rayhit->ray).tfar + lVar1);
        local_b4 = *(undefined4 *)((long)(rayhit->ray).id + lVar1);
        local_b0 = *(undefined4 *)((long)(rayhit->ray).flags + lVar1);
        local_ac = *(undefined4 *)((long)(rayhit->hit).Ng_x + lVar1);
        local_a8 = *(undefined4 *)((long)(rayhit->hit).Ng_y + lVar1);
        local_a4 = *(undefined4 *)((long)(rayhit->hit).Ng_z + lVar1);
        local_a0 = *(undefined4 *)((long)(rayhit->hit).u + lVar1);
        local_9c = *(undefined4 *)((long)(rayhit->hit).v + lVar1);
        local_98 = *(undefined4 *)((long)(rayhit->hit).primID + lVar1);
        local_94 = *(undefined4 *)((long)(rayhit->hit).geomID + lVar1);
        local_90 = *(undefined4 *)((long)(rayhit->hit).instID[0] + lVar1);
        local_8c = *(undefined4 *)((long)(rayhit->hit).instPrimID[0] + lVar1);
        local_88 = *(undefined4 *)((long)rayhit[1].ray.org_x + lVar1);
        (**(code **)(hscene + 0x78))(hscene + 0x58,&local_d8,&local_70);
        *(undefined4 *)((long)(rayhit->ray).org_y + lVar1) = local_d8;
        *(undefined4 *)((long)(rayhit->ray).org_z + lVar1) = local_d4;
        *(undefined4 *)((long)(rayhit->ray).tnear + lVar1) = local_d0;
        *(undefined4 *)((long)(rayhit->ray).dir_x + lVar1) = local_cc;
        *(undefined4 *)((long)(rayhit->ray).dir_y + lVar1) = local_c8;
        *(undefined4 *)((long)(rayhit->ray).dir_z + lVar1) = local_c4;
        *(undefined4 *)((long)(rayhit->ray).time + lVar1) = local_c0;
        *(undefined4 *)((long)(rayhit->ray).tfar + lVar1) = local_bc;
        *(undefined4 *)((long)(rayhit->ray).mask + lVar1) = local_b8;
        *(undefined4 *)((long)(rayhit->ray).id + lVar1) = local_b4;
        *(undefined4 *)((long)(rayhit->ray).flags + lVar1) = local_b0;
        *(undefined4 *)((long)(rayhit->hit).Ng_x + lVar1) = local_ac;
        *(undefined4 *)((long)(rayhit->hit).Ng_y + lVar1) = local_a8;
        *(undefined4 *)((long)(rayhit->hit).Ng_z + lVar1) = local_a4;
        *(undefined4 *)((long)(rayhit->hit).u + lVar1) = local_a0;
        *(undefined4 *)((long)(rayhit->hit).v + lVar1) = local_9c;
        *(undefined4 *)((long)(rayhit->hit).primID + lVar1) = local_98;
        *(undefined4 *)((long)(rayhit->hit).geomID + lVar1) = local_94;
        *(undefined4 *)((long)(rayhit->hit).instID[0] + lVar1) = local_90;
        *(undefined4 *)((long)(rayhit->hit).instPrimID[0] + lVar1) = local_8c;
        *(undefined4 *)((long)rayhit[1].ray.org_x + lVar1) = local_88;
      }
      lVar1 = lVar1 + 4;
    } while (lVar1 != 0);
  }
  else {
    (**(code **)(hscene + 0x128))(valid,hscene + 0x58,rayhit,&local_70);
  }
  return;
}

Assistant:

RTC_API void rtcIntersect16 (const int* valid, RTCScene hscene, RTCRayHit16* rayhit, RTCIntersectArguments* args) 
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcIntersect16);

#if defined(DEBUG)
    RTC_VERIFY_HANDLE(hscene);
    if (scene->isModified()) throw_RTCError(RTC_ERROR_INVALID_OPERATION,"scene not committed");
    if (((size_t)valid) & 0x3F) throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "mask not aligned to 64 bytes");   
    if (((size_t)rayhit)   & 0x3F) throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "rayhit not aligned to 64 bytes");   
#endif
    STAT(size_t cnt=0; for (size_t i=0; i<16; i++) cnt += ((int*)valid)[i] == -1;);
    STAT3(normal.travs,cnt,cnt,cnt);

    RTCIntersectArguments defaultArgs;
    if (unlikely(args == nullptr)) {
      rtcInitIntersectArguments(&defaultArgs);
      args = &defaultArgs;
    }
    RTCRayQueryContext* user_context = args->context;
    
    RTCRayQueryContext defaultContext;
    if (unlikely(user_context == nullptr)) {
      rtcInitRayQueryContext(&defaultContext);
      user_context = &defaultContext;
    }
    RayQueryContext context(scene,user_context,args);

    if (likely(scene->intersectors.intersector16))
      scene->intersectors.intersect16(valid,*rayhit,&context);

    else {
      RayHit16* ray16 = (RayHit16*) rayhit;
      for (size_t i=0; i<16; i++) {
        if (!valid[i]) continue;
        RayHit ray1; ray16->get(i,ray1);
        scene->intersectors.intersect((RTCRayHit&)ray1,&context);
        ray16->set(i,ray1);
      }
    }

    RTC_CATCH_END2(scene);
  }